

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasm.hpp
# Opt level: O2

string * __thiscall qclab::qasm_abi_cxx11_(string *__return_storage_ptr__,qclab *this,double angle)

{
  int iVar1;
  char buffer [32];
  char acStack_38 [40];
  
  iVar1 = sprintf(acStack_38,"%.15f");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_38,acStack_38 + iVar1);
  return __return_storage_ptr__;
}

Assistant:

inline auto qasm( const double angle ) {
    char buffer[32] ;
    int size = std::sprintf( buffer , "%.15f" , angle ) ;
    return std::string( buffer , size ) ;
  }